

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

SourceLocation __thiscall
slang::SourceManager::getFullyOriginalLoc(SourceManager *this,SourceLocation location)

{
  bool bVar1;
  SourceLocation in_RSI;
  shared_lock<std::shared_mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  SourceLocation in_stack_ffffffffffffffb8;
  SourceManager *in_stack_ffffffffffffffc0;
  SourceLocation in_stack_ffffffffffffffc8;
  undefined8 local_10;
  
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)
             CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98
            );
  local_10 = in_RSI;
  while( true ) {
    bVar1 = isMacroLocImpl<std::shared_lock<std::shared_mutex>_>
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,
                       (shared_lock<std::shared_mutex> *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    in_stack_ffffffffffffffb8 =
         getOriginalLocImpl<std::shared_lock<std::shared_mutex>_>
                   (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffc8,
                    (shared_lock<std::shared_mutex> *)in_stack_ffffffffffffffb8);
    local_10 = in_stack_ffffffffffffffb8;
  }
  std::shared_lock<std::shared_mutex>::~shared_lock
            ((shared_lock<std::shared_mutex> *)CONCAT17(bVar1,in_stack_ffffffffffffffa0));
  return local_10;
}

Assistant:

SourceLocation SourceManager::getFullyOriginalLoc(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    while (isMacroLocImpl(location, lock))
        location = getOriginalLocImpl(location, lock);
    return location;
}